

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::anon_unknown_0::Disassembler::HandleInstruction
          (Disassembler *this,spv_parsed_instruction_t *inst)

{
  bool bVar1;
  reference pvVar2;
  spv_parsed_instruction_t *local_80;
  spv_parsed_instruction_t *local_78;
  undefined1 local_70 [8];
  SingleBlock new_block;
  spv_parsed_instruction_t *inst_local;
  Disassembler *this_local;
  
  new_block._80_8_ = inst;
  disassemble::InstructionDisassembler::EmitSectionComment
            (&this->instruction_disassembler_,inst,&this->inserted_decoration_space_,
             &this->inserted_debug_space_,&this->inserted_type_space_);
  if (((this->nested_indent_ & 1U) == 0) && ((this->reorder_blocks_ & 1U) == 0)) {
    disassemble::InstructionDisassembler::EmitInstruction
              (&this->instruction_disassembler_,(spv_parsed_instruction_t *)new_block._80_8_,
               this->byte_offset_);
  }
  else {
    if (*(short *)(new_block._80_8_ + 10) == 0x38) {
      EmitCFG(this);
    }
    else if (*(short *)(new_block._80_8_ + 10) == 0xf8) {
      SingleBlock::SingleBlock((SingleBlock *)local_70);
      local_70 = (undefined1  [8])this->byte_offset_;
      local_78 = (spv_parsed_instruction_t *)new_block._80_8_;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&new_block,&local_78);
      std::
      vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
      ::push_back(&(this->current_function_cfg_).blocks,(value_type *)local_70);
      SingleBlock::~SingleBlock((SingleBlock *)local_70);
      goto LAB_0028757c;
    }
    bVar1 = std::
            vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
            ::empty(&(this->current_function_cfg_).blocks);
    if (bVar1) {
      disassemble::InstructionDisassembler::EmitInstruction
                (&this->instruction_disassembler_,(spv_parsed_instruction_t *)new_block._80_8_,
                 this->byte_offset_);
    }
    else {
      pvVar2 = std::
               vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
               ::back(&(this->current_function_cfg_).blocks);
      local_80 = (spv_parsed_instruction_t *)new_block._80_8_;
      std::
      vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
      ::emplace_back<spv_parsed_instruction_t_const*>
                ((vector<spvtools::(anonymous_namespace)::ParsedInstruction,std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>>
                  *)&pvVar2->instructions,&local_80);
    }
  }
LAB_0028757c:
  this->byte_offset_ = (ulong)*(ushort *)(new_block._80_8_ + 8) * 4 + this->byte_offset_;
  return SPV_SUCCESS;
}

Assistant:

spv_result_t Disassembler::HandleInstruction(
    const spv_parsed_instruction_t& inst) {
  instruction_disassembler_.EmitSectionComment(inst, inserted_decoration_space_,
                                               inserted_debug_space_,
                                               inserted_type_space_);

  // When nesting needs to be calculated or when the blocks are reordered, we
  // have to have the full picture of the CFG first.  Defer processing of the
  // instructions until the entire function is visited.  This is not done
  // without those options (even if simpler) to improve debuggability; for
  // example to be able to see whatever is parsed so far even if there is a
  // parse error.
  if (nested_indent_ || reorder_blocks_) {
    switch (static_cast<spv::Op>(inst.opcode)) {
      case spv::Op::OpLabel: {
        // Add a new block to the CFG
        SingleBlock new_block;
        new_block.byte_offset = byte_offset_;
        new_block.instructions.emplace_back(&inst);
        current_function_cfg_.blocks.push_back(std::move(new_block));
        break;
      }
      case spv::Op::OpFunctionEnd:
        // Process the CFG and output the instructions
        EmitCFG();
        // Output OpFunctionEnd itself too
        [[fallthrough]];
      default:
        if (!current_function_cfg_.blocks.empty()) {
          // If in a function, stash the instruction for later.
          current_function_cfg_.blocks.back().instructions.emplace_back(&inst);
        } else {
          // Otherwise emit the instruction right away.
          instruction_disassembler_.EmitInstruction(inst, byte_offset_);
        }
        break;
    }
  } else {
    instruction_disassembler_.EmitInstruction(inst, byte_offset_);
  }

  byte_offset_ += inst.num_words * sizeof(uint32_t);

  return SPV_SUCCESS;
}